

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VWL2Norm(N_Vector X,N_Vector W,sunindextype param_3,sunindextype global_length,int myid)

{
  bool bVar1;
  double dVar2;
  realtype rVar3;
  double dVar4;
  double local_80;
  double local_70;
  realtype ans;
  double maxt;
  double stop_time;
  double start_time;
  int local_30;
  int failure;
  int fails;
  int myid_local;
  sunindextype global_length_local;
  sunindextype local_length_local;
  N_Vector W_local;
  N_Vector X_local;
  
  local_30 = 0;
  N_VConst(-0.5,X);
  N_VConst(0.5,W);
  dVar2 = get_time();
  rVar3 = N_VWL2Norm(X,W);
  sync_device();
  dVar4 = get_time();
  if (0.0 <= rVar3) {
    if (NAN(rVar3)) {
      bVar1 = true;
    }
    else {
      if (0.0 < (double)global_length) {
        local_70 = sqrt((double)global_length);
      }
      else {
        local_70 = 0.0;
      }
      if (0.0 < (double)global_length) {
        local_80 = sqrt((double)global_length);
      }
      else {
        local_80 = 0.0;
      }
      bVar1 = 1e-15 < ABS(local_70 * -0.25 + rVar3) / ABS(local_80 * 0.25);
    }
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
    printf(">>> FAILED test -- N_VWL2Norm, Proc %d \n",(ulong)(uint)myid);
    local_30 = 1;
  }
  else if (myid == 0) {
    printf("PASSED test -- N_VWL2Norm \n");
  }
  dVar2 = max_time(X,dVar4 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar2,"N_VWL2Norm");
  }
  return local_30;
}

Assistant:

int Test_N_VWL2Norm(N_Vector X, N_Vector W,
                    sunindextype local_length, sunindextype global_length, int myid)
{
  int      fails = 0, failure = 0;
  double   start_time, stop_time, maxt;
  realtype ans;

  /* fill vector data */
  N_VConst(NEG_HALF, X);
  N_VConst(HALF, W);

  start_time = get_time();
  ans = N_VWL2Norm(X, W);
  sync_device();
  stop_time = get_time();

  /* ans should equal 1/4 * sqrt(global_length) */
  failure = (ans < ZERO) ? 1 : FNEQ(ans, HALF*HALF*SUNRsqrt((realtype) global_length));

  if (failure) {
    printf(">>> FAILED test -- N_VWL2Norm, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VWL2Norm \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWL2Norm", maxt);

  return(fails);
}